

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

peer_request __thiscall libtorrent::aux::torrent::to_req(torrent *this,piece_block *p)

{
  int iVar1;
  peer_request pVar2;
  torrent_info *this_00;
  int *piVar3;
  int local_3c;
  int local_38;
  int local_34 [2];
  int local_2c;
  int block;
  int block_offset;
  piece_block *p_local;
  torrent *this_local;
  peer_request r;
  
  iVar1 = p->block_index;
  _block = p;
  p_local = (piece_block *)this;
  local_2c = block_size(this);
  local_2c = iVar1 * local_2c;
  this_00 = torrent_file(this);
  local_38 = (_block->piece_index).m_val;
  local_34[0] = torrent_info::piece_size(this_00,(piece_index_t)local_38);
  local_34[0] = local_34[0] - local_2c;
  local_3c = block_size(this);
  piVar3 = ::std::min<int>(local_34,&local_3c);
  pVar2.start = local_2c;
  pVar2.piece.m_val = (_block->piece_index).m_val;
  pVar2.length = *piVar3;
  return pVar2;
}

Assistant:

peer_request torrent::to_req(piece_block const& p) const
	{
		int const block_offset = p.block_index * block_size();
		int const block = std::min(torrent_file().piece_size(
			p.piece_index) - block_offset, block_size());
		TORRENT_ASSERT(block > 0);
		TORRENT_ASSERT(block <= block_size());

		peer_request r;
		r.piece = p.piece_index;
		r.start = block_offset;
		r.length = block;
		return r;
	}